

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  ulong uVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  pMVar1 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)Lib::alloc(sVar5 * 0x30);
  uVar2 = this->_capacity;
  if (uVar2 == 0) {
    sVar3 = 0;
  }
  else {
    lVar6 = 0;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 ((long)&(pMVar1->numeral)._num._val[0]._mp_alloc + lVar6),
                 (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 ((long)&(this->_stack->numeral)._num._val[0]._mp_alloc + lVar6));
      Kernel::RationalConstantType::~RationalConstantType
                ((RationalConstantType *)
                 ((long)&(this->_stack->numeral)._num._val[0]._mp_alloc + lVar6));
      uVar2 = this->_capacity;
      lVar6 = lVar6 + 0x30;
    }
    Lib::free(this->_stack);
    sVar3 = this->_capacity;
  }
  this->_stack = pMVar1;
  this->_cursor = pMVar1 + sVar3;
  this->_end = pMVar1 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }